

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initTest
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  pointer *pp_Var1;
  bool is_indiced;
  _tessellation_primitive_mode primitive_mode;
  GLint n_patch_vertices_00;
  GLint n_instances;
  iterator __position;
  GLuint *pGVar2;
  int iVar3;
  GLenum GVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  NotSupportedError *this_01;
  long lVar7;
  long lVar8;
  GLint n_patch_vertices [3];
  _run run;
  GLint gl_max_patch_vertices_value;
  char *vs_body;
  char *fs_body;
  GLuint shaders [2];
  GLint local_c4;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [32];
  GLuint GStack_98;
  _tessellation_primitive_mode _Stack_94;
  GLuint GStack_90;
  GLuint local_8c;
  GLuint *local_88;
  Functions *local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>>
  *local_58;
  GLint local_4c;
  char *local_48;
  char *local_40;
  GLuint local_38;
  GLuint local_34;
  Functions *pFVar6;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pFVar6 = (Functions *)CONCAT44(extraout_var,iVar3);
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,pFVar6,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*pFVar6->genVertexArrays)(1,&this->m_vao_id);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3f4);
    (*pFVar6->bindVertexArray)(this->m_vao_id);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3f7);
    local_88 = &this->m_bo_id;
    (*pFVar6->genBuffers)(1,local_88);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glGenBuffers() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3fb);
    GVar5 = (*pFVar6->createShader)(0x8b30);
    this->m_fs_id = GVar5;
    GVar5 = (*pFVar6->createShader)(0x8b31);
    this->m_vs_id = GVar5;
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glCreateShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x3ff);
    local_40 = "${VERSION}\n\nvoid main()\n{\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&local_40);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glShaderSource() failed for fragment shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x409);
    local_48 = 
    "${VERSION}\n\nin vec4 vertex_data;\n\nvoid main()\n{\n    gl_Position = vertex_data;\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&local_48);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glShaderSource() failed for vertex shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x416);
    local_38 = this->m_fs_id;
    local_34 = this->m_vs_id;
    TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,&local_38,true);
    local_4c = 0;
    (*pFVar6->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,&local_4c);
    local_80 = pFVar6;
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x422);
    local_c4 = 4;
    local_c0 = local_4c / 2;
    local_bc = local_4c;
    local_58 = (vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>>
                *)&this->m_runs;
    lVar8 = 0;
    do {
      local_78 = lVar8;
      primitive_mode = (&DAT_01bab8b0)[lVar8];
      lVar8 = 0;
      do {
        local_70 = lVar8;
        n_patch_vertices_00 = (&local_c4)[lVar8];
        lVar8 = 0;
        do {
          is_indiced = (bool)(&DAT_01bab8ac)[lVar8];
          lVar7 = 0;
          local_68 = lVar8;
          do {
            n_instances = deqp::gles31::Functional::ShaderTextureSizeTests::init::sampleCounts
                          [lVar7];
            lVar8 = 0;
            local_60 = lVar7;
            do {
              local_b8._0_8_ = (pointer)0x0;
              local_b8._8_4_ = local_b8._8_4_ & 0xffffff00;
              local_b8._28_4_ = 0;
              GStack_98 = 0;
              local_b8._12_4_ = 0;
              local_b8._16_4_ = 0;
              local_b8._20_4_ = 0;
              local_b8._24_4_ = 0;
              _Stack_94 = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
              GStack_90 = 0;
              local_8c = 0;
              initRun(this,(_run *)local_b8,primitive_mode,n_patch_vertices_00,is_indiced,
                      n_instances,*(uint *)((long)&DAT_01bab89c + lVar8));
              __position._M_current =
                   (this->m_runs).
                   super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->m_runs).
                  super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>>
                ::
                _M_realloc_insert<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_const&>
                          (local_58,__position,(_run *)local_b8);
              }
              else {
                (__position._M_current)->po_id = GStack_98;
                (__position._M_current)->primitive_mode = _Stack_94;
                (__position._M_current)->tc_id = GStack_90;
                (__position._M_current)->te_id = local_8c;
                (__position._M_current)->n_instances = local_b8._16_4_;
                (__position._M_current)->n_patch_vertices = local_b8._20_4_;
                (__position._M_current)->n_restart_indices = local_b8._24_4_;
                (__position._M_current)->n_result_vertices = local_b8._28_4_;
                (__position._M_current)->bo_indices_id = local_b8._0_4_;
                (__position._M_current)->drawcall_count_multiplier = local_b8._4_4_;
                (__position._M_current)->drawcall_is_indiced = (bool)(char)local_b8._8_4_;
                *(int3 *)&(__position._M_current)->field_0x9 = SUB43(local_b8._8_4_,1);
                (__position._M_current)->drawcall_n_instances = local_b8._12_4_;
                pp_Var1 = &(this->m_runs).
                           super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pp_Var1 = *pp_Var1 + 1;
              }
              pFVar6 = local_80;
              pGVar2 = local_88;
              lVar8 = lVar8 + 4;
            } while (lVar8 == 4);
            lVar7 = local_60 + 1;
          } while (local_60 == 0);
          lVar8 = local_68 + 1;
        } while (local_68 == 0);
        lVar8 = local_70 + 1;
      } while (lVar8 != 3);
      lVar8 = local_78 + 1;
    } while (lVar8 != 3);
    (*local_80->bindBuffer)(0x8c8e,*local_88);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x45e);
    (*pFVar6->bindBufferBase)(0x8c8e,0,*pGVar2);
    GVar4 = (*pFVar6->getError)();
    glu::checkError(GVar4,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x461);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_b8);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Set up Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Generate all test-wide objects needed for test execution */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "in vec4 vertex_data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vertex_data;\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true /* should_succeed */);

	/* Retrieve GL_MAX_PATCH_VERTICES_EXT value before we continue */
	glw::GLint gl_max_patch_vertices_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &gl_max_patch_vertices_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname");

	/* Initialize all test passes */
	const unsigned int drawcall_count_multipliers[] = { 3, 6 };
	const bool		   is_indiced_draw_call_flags[] = { false, true };
	const glw::GLint   n_instances[]				= { 1, 4 };
	const glw::GLint   n_patch_vertices[] = { 4, gl_max_patch_vertices_value / 2, gl_max_patch_vertices_value };
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_drawcall_count_multipliers =
		sizeof(drawcall_count_multipliers) / sizeof(drawcall_count_multipliers[0]);
	const unsigned int n_is_indiced_draw_call_flags =
		sizeof(is_indiced_draw_call_flags) / sizeof(is_indiced_draw_call_flags[0]);
	const unsigned int n_n_instances	  = sizeof(n_instances) / sizeof(n_instances[0]);
	const unsigned int n_n_patch_vertices = sizeof(n_patch_vertices) / sizeof(n_patch_vertices[0]);
	const unsigned int n_primitive_modes  = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode current_primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_patch_vertices_item = 0; n_patch_vertices_item < n_n_patch_vertices;
			 ++n_patch_vertices_item)
		{
			glw::GLint current_n_patch_vertices = n_patch_vertices[n_patch_vertices_item];

			for (unsigned int n_is_indiced_draw_call_flag = 0;
				 n_is_indiced_draw_call_flag < n_is_indiced_draw_call_flags; ++n_is_indiced_draw_call_flag)
			{
				bool current_is_indiced_draw_call = is_indiced_draw_call_flags[n_is_indiced_draw_call_flag];

				for (unsigned int n_instances_item = 0; n_instances_item < n_n_instances; ++n_instances_item)
				{
					glw::GLint current_n_instances = n_instances[n_instances_item];

					for (unsigned int n_drawcall_count_multiplier = 0;
						 n_drawcall_count_multiplier < n_drawcall_count_multipliers; ++n_drawcall_count_multiplier)
					{
						const unsigned int drawcall_count_multiplier =
							drawcall_count_multipliers[n_drawcall_count_multiplier];

						/* Form the run descriptor */
						_run run;

						initRun(run, current_primitive_mode, current_n_patch_vertices, current_is_indiced_draw_call,
								current_n_instances, drawcall_count_multiplier);

						/* Store the descriptor for later execution */
						m_runs.push_back(run);
					}
				} /* for (all 'number of instances' settings) */
			}	 /* for (all 'is indiced draw call' flags) */
		}		  /* for (all 'n patch vertices' settings) */
	}			  /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}